

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O2

int png_image_write_to_file
              (png_imagep image,char *file_name,int convert_to_8bit,void *buffer,
              png_int_32 row_stride,void *colormap)

{
  int iVar1;
  FILE *__stream;
  int *piVar2;
  char *error_message;
  
  if (image == (png_imagep)0x0) {
    return 0;
  }
  if (image->version == 1) {
    if (buffer == (void *)0x0 || file_name == (char *)0x0) {
      error_message = "png_image_write_to_file: invalid argument";
    }
    else {
      __stream = fopen(file_name,"wb");
      if (__stream == (FILE *)0x0) {
        piVar2 = __errno_location();
        iVar1 = *piVar2;
      }
      else {
        iVar1 = png_image_write_to_stdio
                          (image,(FILE *)__stream,convert_to_8bit,buffer,row_stride,colormap);
        if (iVar1 == 0) {
          fclose(__stream);
          remove(file_name);
          return 0;
        }
        iVar1 = fflush(__stream);
        if ((iVar1 == 0) && (iVar1 = ferror(__stream), iVar1 == 0)) {
          iVar1 = fclose(__stream);
          if (iVar1 == 0) {
            return 1;
          }
          piVar2 = __errno_location();
          iVar1 = *piVar2;
        }
        else {
          piVar2 = __errno_location();
          iVar1 = *piVar2;
          fclose(__stream);
        }
        remove(file_name);
      }
      error_message = strerror(iVar1);
    }
  }
  else {
    error_message = "png_image_write_to_file: incorrect PNG_IMAGE_VERSION";
  }
  iVar1 = png_image_error(image,error_message);
  return iVar1;
}

Assistant:

int PNGAPI
png_image_write_to_file(png_imagep image, const char *file_name,
    int convert_to_8bit, const void *buffer, png_int_32 row_stride,
    const void *colormap)
{
   /* Write the image to the named file. */
   if (image != NULL && image->version == PNG_IMAGE_VERSION)
   {
      if (file_name != NULL && buffer != NULL)
      {
         FILE *fp = fopen(file_name, "wb");

         if (fp != NULL)
         {
            if (png_image_write_to_stdio(image, fp, convert_to_8bit, buffer,
                row_stride, colormap) != 0)
            {
               int error; /* from fflush/fclose */

               /* Make sure the file is flushed correctly. */
               if (fflush(fp) == 0 && ferror(fp) == 0)
               {
                  if (fclose(fp) == 0)
                     return 1;

                  error = errno; /* from fclose */
               }

               else
               {
                  error = errno; /* from fflush or ferror */
                  (void)fclose(fp);
               }

               (void)remove(file_name);
               /* The image has already been cleaned up; this is just used to
                * set the error (because the original write succeeded).
                */
               return png_image_error(image, strerror(error));
            }

            else
            {
               /* Clean up: just the opened file. */
               (void)fclose(fp);
               (void)remove(file_name);
               return 0;
            }
         }

         else
            return png_image_error(image, strerror(errno));
      }

      else
         return png_image_error(image,
             "png_image_write_to_file: invalid argument");
   }

   else if (image != NULL)
      return png_image_error(image,
          "png_image_write_to_file: incorrect PNG_IMAGE_VERSION");

   else
      return 0;
}